

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  undefined8 *in_RDI;
  char *original_dir;
  int gtest_retval;
  ExecDeathTestArgs *args;
  char *in_stack_fffffffffffffd10;
  allocator<char> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 uVar4;
  string local_2d8 [16];
  int *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  char *local_148;
  undefined4 local_13c;
  string local_138 [55];
  undefined1 local_101 [33];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  undefined8 *local_18;
  
  local_18 = in_RDI;
  do {
    do {
      local_1c = close(*(int *)(local_18 + 1));
      uVar4 = false;
      if (local_1c == -1) {
        piVar3 = __errno_location();
        uVar4 = *piVar3 == 4;
      }
    } while ((bool)uVar4 != false);
    if (local_1c == -1) {
      in_stack_fffffffffffffd18 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                 (allocator<char> *)in_stack_fffffffffffffd40);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      local_13c = 0x4d6;
      StreamableToString<int>(in_stack_fffffffffffffd38);
      std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffffd20));
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string((string *)(local_101 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_101);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  UnitTest::GetInstance();
  local_148 = UnitTest::original_working_dir((UnitTest *)0x58e563);
  iVar2 = chdir(local_148);
  if (iVar2 == 0) {
    execv(*(char **)*local_18,(char **)*local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
               (allocator<char> *)in_stack_fffffffffffffd40);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffffd20));
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd4f);
  }
  else {
    __rhs = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
               (allocator<char> *)in_stack_fffffffffffffd40);
    std::operator+(in_stack_fffffffffffffd18,(char *)__rhs);
    std::operator+(in_stack_fffffffffffffd18,(char *)__rhs);
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffffd20));
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}